

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

BrailleCanvas * __thiscall
plot::BrailleCanvas::rect
          (BrailleCanvas *this,Color *stroke_color,Color *fill_color,Rect rct,TerminalOp op)

{
  Rect rct_00;
  Point from;
  Point from_00;
  Point from_01;
  Point from_02;
  Color *pCVar1;
  BrailleCanvas *pBVar2;
  GenericPoint<long> local_128;
  GenericPoint<long> local_118;
  GenericRect<long> local_108;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  Point local_c8;
  long local_b8;
  long local_b0;
  Point local_a8;
  long local_98;
  long local_90;
  Point local_88;
  long local_78;
  long local_70;
  Point local_68;
  long local_58;
  long local_50;
  GenericRect<long> local_48;
  TerminalOp local_24;
  Color *pCStack_20;
  TerminalOp op_local;
  Color *fill_color_local;
  Color *stroke_color_local;
  BrailleCanvas *this_local;
  
  local_24 = op;
  pCStack_20 = fill_color;
  fill_color_local = stroke_color;
  stroke_color_local = (Color *)this;
  GenericRect<long>::sorted(&local_48,&rct);
  rct.p1.x = local_48.p1.x;
  rct.p1.y = local_48.p1.y;
  rct.p2.x = local_48.p2.x;
  rct.p2.y = local_48.p2.y;
  pBVar2 = push(this);
  pCVar1 = fill_color_local;
  local_58 = rct.p1.x;
  local_50 = rct.p1.y;
  GenericPoint<long>::GenericPoint(&local_68,rct.p2.x,rct.p1.y);
  from_02.y = local_50;
  from_02.x = local_58;
  pBVar2 = line(pBVar2,pCVar1,from_02,local_68,Over);
  pCVar1 = fill_color_local;
  local_78 = rct.p1.x;
  local_70 = rct.p1.y;
  GenericPoint<long>::GenericPoint(&local_88,rct.p1.x,rct.p2.y);
  from_01.y = local_70;
  from_01.x = local_78;
  pBVar2 = line(pBVar2,pCVar1,from_01,local_88,Over);
  pCVar1 = fill_color_local;
  local_98 = rct.p2.x;
  local_90 = rct.p2.y;
  GenericPoint<long>::GenericPoint(&local_a8,rct.p2.x,rct.p1.y);
  from_00.y = local_90;
  from_00.x = local_98;
  pBVar2 = line(pBVar2,pCVar1,from_00,local_a8,Over);
  pCVar1 = fill_color_local;
  local_b8 = rct.p2.x;
  local_b0 = rct.p2.y;
  GenericPoint<long>::GenericPoint(&local_c8,rct.p1.x,rct.p2.y);
  from.y = local_b0;
  from.x = local_b8;
  pBVar2 = line(pBVar2,pCVar1,from,local_c8,Over);
  pCVar1 = pCStack_20;
  local_e8 = rct.p1.x;
  local_e0 = rct.p1.y;
  local_d8 = rct.p2.x;
  local_d0 = rct.p2.y;
  GenericPoint<long>::GenericPoint(&local_128,1,1);
  local_118 = operator+(&rct.p1,&local_128);
  GenericRect<long>::GenericRect(&local_108,&local_118,&rct.p2);
  rct_00.p1.y = local_e0;
  rct_00.p1.x = local_e8;
  rct_00.p2.x = local_d8;
  rct_00.p2.y = local_d0;
  pBVar2 = fill<plot::BrailleCanvas::rect(plot::Color_const&,plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(plot::GenericPoint<long>)_1_>
                     (pBVar2,pCVar1,rct_00,(anon_class_32_1_54a39812 *)&local_108,Over);
  pBVar2 = pop(pBVar2,local_24);
  return pBVar2;
}

Assistant:

BrailleCanvas& rect(Color const& stroke_color, Color const& fill_color, Rect rct, TerminalOp op = TerminalOp::Over) {
        rct = rct.sorted();
        return push()
              .line(stroke_color, rct.p1, { rct.p2.x, rct.p1.y }, TerminalOp::Over)
              .line(stroke_color, rct.p1, { rct.p1.x, rct.p2.y }, TerminalOp::Over)
              .line(stroke_color, rct.p2, { rct.p2.x, rct.p1.y }, TerminalOp::Over)
              .line(stroke_color, rct.p2, { rct.p1.x, rct.p2.y }, TerminalOp::Over)
              .fill(fill_color, rct, [r=Rect(rct.p1 + Point(1, 1), rct.p2)](Point p) {
                  return r.contains(p);
              }, TerminalOp::Over)
              .pop(op);
    }